

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggwave.cpp
# Opt level: O0

int __thiscall GGWave::maxBytesPerTx(GGWave *this,Protocols *protocols)

{
  int iVar1;
  Protocol *pPVar2;
  Protocols *in_RSI;
  Protocol *protocol;
  int i;
  int res;
  int local_28;
  int local_18;
  int local_14;
  
  local_14 = 1;
  for (local_18 = 0; iVar1 = Protocols::size(in_RSI), local_18 < iVar1; local_18 = local_18 + 1) {
    pPVar2 = Protocols::operator[](in_RSI,local_18);
    if ((pPVar2->enabled & 1U) != 0) {
      if (local_14 < pPVar2->bytesPerTx) {
        local_28 = (int)pPVar2->bytesPerTx;
      }
      else {
        local_28 = local_14;
      }
      local_14 = local_28;
    }
  }
  return local_14;
}

Assistant:

int GGWave::maxBytesPerTx(const Protocols & protocols) const {
    int res = 1;
    for (int i = 0; i < protocols.size(); ++i) {
        const auto & protocol = protocols[i];
        if (protocol.enabled == false) {
            continue;
        }
        res = GG_MAX(res, (int) protocol.bytesPerTx);
    }
    return res;
}